

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O2

void __thiscall iqxmlrpc::Pool_executor_factory::~Pool_executor_factory(Pool_executor_factory *this)

{
  scoped_lock lk;
  unique_lock<boost::mutex> uStack_78;
  _Deque_iterator<iqxmlrpc::Pool_executor_*,_iqxmlrpc::Pool_executor_*&,_iqxmlrpc::Pool_executor_**>
  local_68;
  _Deque_iterator<iqxmlrpc::Pool_executor_*,_iqxmlrpc::Pool_executor_*&,_iqxmlrpc::Pool_executor_**>
  local_48;
  
  (this->super_Executor_factory_base)._vptr_Executor_factory_base =
       (_func_int **)&PTR__Pool_executor_factory_0019c3e0;
  destruction_started(this);
  boost::thread_group::join_all(&this->threads);
  util::
  delete_ptrs<__gnu_cxx::__normal_iterator<iqxmlrpc::Pool_executor_factory::Pool_thread**,std::vector<iqxmlrpc::Pool_executor_factory::Pool_thread*,std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread*>>>>
            ((__normal_iterator<iqxmlrpc::Pool_executor_factory::Pool_thread_**,_std::vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>_>
              )(this->pool).
               super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<iqxmlrpc::Pool_executor_factory::Pool_thread_**,_std::vector<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>_>
              )(this->pool).
               super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  boost::unique_lock<boost::mutex>::unique_lock(&uStack_78,&this->req_queue_lock);
  local_48._M_cur =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_48._M_first =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_first;
  local_48._M_last =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  local_48._M_node =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_node;
  local_68._M_cur =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_68._M_first =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_first;
  local_68._M_last =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_last;
  local_68._M_node =
       (this->req_queue).
       super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  util::
  delete_ptrs<std::_Deque_iterator<iqxmlrpc::Pool_executor*,iqxmlrpc::Pool_executor*&,iqxmlrpc::Pool_executor**>>
            (&local_48,&local_68);
  boost::unique_lock<boost::mutex>::~unique_lock(&uStack_78);
  boost::mutex::~mutex(&this->destructor_lock);
  boost::condition_variable_any::~condition_variable_any(&this->req_queue_cond);
  boost::mutex::~mutex(&this->req_queue_lock);
  std::_Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>::
  ~_Deque_base(&(this->req_queue).
                super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>
              );
  std::
  _Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
  ::~_Vector_base(&(this->pool).
                   super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
                 );
  boost::thread_group::~thread_group(&this->threads);
  return;
}

Assistant:

Pool_executor_factory::~Pool_executor_factory()
{
  destruction_started();
  threads.join_all();

  util::delete_ptrs(pool.begin(), pool.end());
  scoped_lock lk(req_queue_lock);
  util::delete_ptrs(req_queue.begin(), req_queue.end());
}